

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_batch_test.cc
# Opt level: O0

void __thiscall leveldb::_Test_Empty::_Run(_Test_Empty *this)

{
  int local_3a8 [2];
  Tester local_3a0;
  leveldb local_200 [48];
  Tester local_1d0;
  undefined1 local_30 [8];
  WriteBatch batch;
  _Test_Empty *this_local;
  
  batch._24_8_ = this;
  WriteBatch::WriteBatch((WriteBatch *)local_30);
  test::Tester::Tester
            (&local_1d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/write_batch_test.cc"
             ,0x3b);
  PrintContents_abi_cxx11_(local_200,(WriteBatch *)local_30);
  test::Tester::IsEq<char[1],std::__cxx11::string>
            (&local_1d0,(char (*) [1])0x117022,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_200);
  std::__cxx11::string::~string((string *)local_200);
  test::Tester::~Tester(&local_1d0);
  test::Tester::Tester
            (&local_3a0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/write_batch_test.cc"
             ,0x3c);
  local_3a8[1] = 0;
  local_3a8[0] = WriteBatchInternal::Count((WriteBatch *)local_30);
  test::Tester::IsEq<int,int>(&local_3a0,local_3a8 + 1,local_3a8);
  test::Tester::~Tester(&local_3a0);
  WriteBatch::~WriteBatch((WriteBatch *)local_30);
  return;
}

Assistant:

TEST(WriteBatchTest, Empty) {
  WriteBatch batch;
  ASSERT_EQ("", PrintContents(&batch));
  ASSERT_EQ(0, WriteBatchInternal::Count(&batch));
}